

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

void unknowntag_end(xar *xar,char *name)

{
  unknown_tag *__ptr;
  int iVar1;
  
  __ptr = xar->unknowntags;
  if (name != (char *)0x0 && __ptr != (unknown_tag *)0x0) {
    iVar1 = strcmp((__ptr->name).s,name);
    if (iVar1 == 0) {
      xar->unknowntags = __ptr->next;
      archive_string_free(&__ptr->name);
      free(__ptr);
      if (xar->unknowntags == (unknown_tag *)0x0) {
        xar->xmlsts = xar->xmlsts_unknown;
      }
    }
  }
  return;
}

Assistant:

static void
unknowntag_end(struct xar *xar, const char *name)
{
	struct unknown_tag *tag;

	tag = xar->unknowntags;
	if (tag == NULL || name == NULL)
		return;
	if (strcmp(tag->name.s, name) == 0) {
		xar->unknowntags = tag->next;
		archive_string_free(&(tag->name));
		free(tag);
		if (xar->unknowntags == NULL) {
#if DEBUG
			fprintf(stderr, "UNKNOWNTAG_END:%s\n", name);
#endif
			xar->xmlsts = xar->xmlsts_unknown;
		}
	}
}